

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  float lhs;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  float fVar6;
  int iVar7;
  float *pfVar8;
  uint *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [64];
  uint in_stack_00000010;
  ImVec2 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  uint v_new_1;
  float new_clicked_t;
  uint v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  int v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_logarithmic;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float x1;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 uVar19;
  undefined1 uVar20;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  ImGuiInputReadMode in_stack_ffffffffffffff58;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff5c;
  ImVec2 local_a0;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float local_78;
  float local_74;
  float fStack_70;
  float zero_deadzone_halfsize_00;
  uint in_stack_ffffffffffffff9c;
  float logarithmic_zero_epsilon_00;
  undefined1 uVar21;
  byte bVar22;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 is_logarithmic_00;
  float fVar23;
  float local_44;
  undefined1 extraout_var [56];
  
  pIVar5 = GImGui;
  is_logarithmic_00 = (undefined1)((uint)in_stack_ffffffffffffffa0 >> 0x18);
  bVar9 = (in_stack_00000010 & 0x100000) != 0;
  bVar10 = in_EDX == 8;
  bVar11 = in_EDX == 9;
  uVar20 = bVar10 || bVar11;
  bVar12 = (in_stack_00000010 & 0x20) != 0;
  uVar19 = bVar12 && (bool)uVar20;
  fVar13 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  fVar14 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  fVar14 = (fVar13 - fVar14) - 4.0;
  local_44 = (pIVar5->Style).GrabMinSize;
  if (in_R8D < in_R9D) {
    fVar6 = (float)(in_R9D - in_R8D);
  }
  else {
    fVar6 = (float)(in_R8D - in_R9D);
  }
  x1 = fVar6;
  if ((!bVar10 && !bVar11) && (-1 < (int)fVar6)) {
    local_44 = ImMax<float>(fVar14 / (float)((int)fVar6 + 1),(pIVar5->Style).GrabMinSize);
  }
  fVar15 = ImMin<float>(local_44,fVar14);
  lhs = fVar14 - fVar15;
  fVar16 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  fVar16 = fVar15 * 0.5 + fVar16 + 2.0;
  fVar17 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  fVar15 = -fVar15 * 0.5 + (fVar17 - 2.0);
  fVar17 = 0.0;
  fVar23 = 0.0;
  if (bVar12 && (bVar10 || bVar11)) {
    if (bVar10 || bVar11) {
      in_stack_ffffffffffffff28 =
           (float)ImParseFormatPrecision
                            ((char *)CONCAT44(x1,in_stack_ffffffffffffff28),
                             (int)in_stack_ffffffffffffff24);
    }
    else {
      in_stack_ffffffffffffff28 = 1.4013e-45;
    }
    fVar23 = in_stack_ffffffffffffff28;
    fVar17 = ImPow(0.0,3.010526e-39);
    is_logarithmic_00 = (undefined1)((uint)fVar23 >> 0x18);
    in_stack_ffffffffffffff24 = (pIVar5->Style).LogSliderDeadzone * 0.5;
    fVar23 = ImMax<float>(lhs,1.0);
    fVar23 = in_stack_ffffffffffffff24 / fVar23;
  }
  bVar22 = 0;
  if (pIVar5->ActiveId == in_ESI) {
    logarithmic_zero_epsilon_00 = (float)(in_stack_ffffffffffffff9c & 0xffff);
    zero_deadzone_halfsize_00 = 0.0;
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar5->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar8 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        if (lhs <= 0.0) {
          in_stack_ffffffffffffff20 = 0.0;
        }
        else {
          in_stack_ffffffffffffff20 = ImClamp<float>((*pfVar8 - fVar16) / lhs,0.0,1.0);
        }
        zero_deadzone_halfsize_00 = in_stack_ffffffffffffff20;
        if (bVar9) {
          zero_deadzone_halfsize_00 = 1.0 - in_stack_ffffffffffffff20;
        }
        logarithmic_zero_epsilon_00 =
             (float)CONCAT13((char)((uint)logarithmic_zero_epsilon_00 >> 0x18),
                             CONCAT12(1,SUB42(logarithmic_zero_epsilon_00,0)));
      }
    }
    else if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar5->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar5->SliderCurrentAccum = 0.0;
        pIVar5->SliderCurrentAccumDirty = false;
      }
      auVar18._0_8_ =
           GetNavInputAmount2d(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                               in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      auVar18._8_56_ = extraout_var;
      uVar1 = vmovlpd_avx(auVar18._0_16_);
      if (bVar9) {
        fStack_70 = (float)((ulong)uVar1 >> 0x20);
        local_74 = -fStack_70;
      }
      else {
        local_74 = (float)uVar1;
      }
      if ((local_74 != 0.0) || (NAN(local_74))) {
        if (bVar10 || bVar11) {
          iVar7 = ImParseFormatPrecision
                            ((char *)CONCAT44(x1,in_stack_ffffffffffffff28),
                             (int)in_stack_ffffffffffffff24);
        }
        else {
          iVar7 = 0;
        }
        if (iVar7 < 1) {
          if (((-100.0 <= (float)(int)fVar6) && ((float)(int)fVar6 <= 100.0)) ||
             (bVar10 = IsNavInputDown(0xe), bVar10)) {
            auVar2 = vcmpss_avx(ZEXT416((uint)local_74),ZEXT816(0) << 0x40,1);
            auVar2 = vblendvps_avx(SUB6416(ZEXT464(0x3f800000),0),SUB6416(ZEXT464(0xbf800000),0),
                                   auVar2);
            local_78 = auVar2._0_4_ / (float)(int)fVar6;
          }
          else {
            local_78 = local_74 / 100.0;
          }
        }
        else {
          local_78 = local_74 / 100.0;
          bVar10 = IsNavInputDown(0xe);
          if (bVar10) {
            local_78 = local_78 / 10.0;
          }
        }
        bVar10 = IsNavInputDown(0xf);
        if (bVar10) {
          local_78 = local_78 * 10.0;
        }
        pIVar5->SliderCurrentAccum = local_78 + pIVar5->SliderCurrentAccum;
        pIVar5->SliderCurrentAccumDirty = true;
      }
      in_stack_ffffffffffffff80 = pIVar5->SliderCurrentAccum;
      if ((pIVar5->NavActivatePressedId == in_ESI) && ((pIVar5->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar5->SliderCurrentAccumDirty & 1U) != 0) {
        zero_deadzone_halfsize_00 =
             ScaleRatioFromValueT<unsigned_int,int,float>
                       ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                        SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68);
        uVar21 = (undefined1)((uint)logarithmic_zero_epsilon_00 >> 0x18);
        if (((1.0 <= zero_deadzone_halfsize_00) && (0.0 < in_stack_ffffffffffffff80)) ||
           ((zero_deadzone_halfsize_00 <= 0.0 && (in_stack_ffffffffffffff80 < 0.0)))) {
          logarithmic_zero_epsilon_00 =
               (float)CONCAT13(uVar21,(uint3)SUB42(logarithmic_zero_epsilon_00,0));
          pIVar5->SliderCurrentAccum = 0.0;
        }
        else {
          logarithmic_zero_epsilon_00 =
               (float)CONCAT13(uVar21,CONCAT12(1,SUB42(logarithmic_zero_epsilon_00,0)));
          fVar6 = ImSaturate(zero_deadzone_halfsize_00 + in_stack_ffffffffffffff80);
          in_stack_ffffffffffffff78 =
               ScaleValueFromRatioT<unsigned_int,int,float>
                         ((ImGuiDataType)fVar16,fVar15,(uint)fVar17,(uint)fVar23,
                          (bool)is_logarithmic_00,logarithmic_zero_epsilon_00,fVar6);
          in_stack_ffffffffffffff7c = zero_deadzone_halfsize_00;
          if ((in_stack_00000010 & 0x40) == 0) {
            in_stack_ffffffffffffff78 =
                 RoundScalarWithFormatT<unsigned_int,int>
                           ((char *)CONCAT44(zero_deadzone_halfsize_00,in_stack_ffffffffffffff78),
                            (ImGuiDataType)in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
            in_stack_ffffffffffffff7c = zero_deadzone_halfsize_00;
          }
          zero_deadzone_halfsize_00 = fVar6;
          in_stack_ffffffffffffff74 =
               ScaleRatioFromValueT<unsigned_int,int,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                          SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68);
          if (in_stack_ffffffffffffff80 <= 0.0) {
            fVar6 = ImMax<float>(in_stack_ffffffffffffff74 - in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff80);
            pIVar5->SliderCurrentAccum = pIVar5->SliderCurrentAccum - fVar6;
          }
          else {
            fVar6 = ImMin<float>(in_stack_ffffffffffffff74 - in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff80);
            pIVar5->SliderCurrentAccum = pIVar5->SliderCurrentAccum - fVar6;
          }
        }
        pIVar5->SliderCurrentAccumDirty = false;
      }
    }
    if (((uint)logarithmic_zero_epsilon_00 & 0x10000) != 0) {
      in_stack_ffffffffffffff70 =
           ScaleValueFromRatioT<unsigned_int,int,float>
                     ((ImGuiDataType)fVar16,fVar15,(uint)fVar17,(uint)fVar23,(bool)is_logarithmic_00
                      ,logarithmic_zero_epsilon_00,zero_deadzone_halfsize_00);
      if ((in_stack_00000010 & 0x40) == 0) {
        in_stack_ffffffffffffff70 =
             RoundScalarWithFormatT<unsigned_int,int>
                       ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (ImGuiDataType)in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      }
      if (*in_RCX != in_stack_ffffffffffffff70) {
        *in_RCX = in_stack_ffffffffffffff70;
        logarithmic_zero_epsilon_00 = 2.3509887e-38;
      }
    }
    bVar22 = (byte)((uint)logarithmic_zero_epsilon_00 >> 0x18);
  }
  if (1.0 <= fVar14) {
    fVar14 = ScaleRatioFromValueT<unsigned_int,int,float>
                       ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                        SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68);
    if (bVar9) {
      fVar14 = 1.0 - fVar14;
    }
    ImLerp<float>(fVar16,fVar15,fVar14);
    if (bVar9) {
      ImRect::ImRect((ImRect *)
                     CONCAT17(uVar20,CONCAT16(uVar19,CONCAT24(in_stack_ffffffffffffff34,fVar13))),x1
                     ,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
      ;
      *in_stack_00000018 = local_c8;
      in_stack_00000018[1] = local_c0;
    }
    else {
      ImRect::ImRect((ImRect *)
                     CONCAT17(uVar20,CONCAT16(uVar19,CONCAT24(in_stack_ffffffffffffff34,fVar13))),x1
                     ,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
      ;
      *in_stack_00000018 = local_b8;
      IVar3.y = in_stack_ffffffffffffff54;
      IVar3.x = in_stack_ffffffffffffff50;
      in_stack_00000018[1] = IVar3;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_a0,in_RDI,in_RDI);
    *in_stack_00000018 = local_a0;
    IVar4.y = in_stack_ffffffffffffff6c;
    IVar4.x = in_stack_ffffffffffffff68;
    in_stack_00000018[1] = IVar4;
  }
  return (bool)(bVar22 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}